

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

ssize_t httplib::detail::write_content
                  (Stream *strm,ContentProviderWithCloser *content_provider,size_t offset,
                  size_t length)

{
  ulong uVar1;
  unsigned_long uVar2;
  ssize_t written_length;
  long local_a8;
  ulong local_a0;
  size_t local_98;
  Stream *local_90;
  ulong local_88;
  _Any_data local_80;
  code *local_70;
  code *local_68;
  _Any_data local_60;
  code *local_50;
  code *local_48;
  unsigned_long local_40;
  ulong local_38;
  
  local_88 = length + offset;
  local_a0 = offset;
  local_98 = offset;
  local_90 = strm;
  while( true ) {
    uVar1 = local_a0;
    uVar2 = local_88 - local_a0;
    if (local_88 < local_a0 || uVar2 == 0) {
      return local_a0 - local_98;
    }
    local_a8 = 0;
    local_60._8_8_ = 0;
    local_60._M_unused._M_object = operator_new(0x18);
    *(ulong **)local_60._M_unused._0_8_ = &local_a0;
    *(long **)((long)local_60._M_unused._0_8_ + 8) = &local_a8;
    *(Stream **)((long)local_60._M_unused._0_8_ + 0x10) = local_90;
    local_48 = std::
               _Function_handler<void_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/deps/cpp-httplib/httplib.h:1734:9)>
               ::_M_invoke;
    local_50 = std::
               _Function_handler<void_(const_char_*,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/deps/cpp-httplib/httplib.h:1734:9)>
               ::_M_manager;
    local_80._8_8_ = 0;
    local_68 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/deps/cpp-httplib/httplib.h:1738:9)>
               ::_M_invoke;
    local_70 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/deps/cpp-httplib/httplib.h:1738:9)>
               ::_M_manager;
    local_38 = uVar1;
    local_40 = uVar2;
    if ((content_provider->super__Function_base)._M_manager == (_Manager_type)0x0) break;
    local_80._M_unused._M_object = &local_a8;
    (*content_provider->_M_invoker)
              ((_Any_data *)content_provider,&local_38,&local_40,
               (function<void_(const_char_*,_unsigned_long)> *)&local_60,
               (function<void_()> *)&local_80);
    if (local_70 != (code *)0x0) {
      (*local_70)(&local_80,&local_80,__destroy_functor);
    }
    if (local_50 != (code *)0x0) {
      (*local_50)(&local_60,&local_60,__destroy_functor);
    }
    if (local_a8 < 0) {
      return local_a8;
    }
  }
  local_80._M_unused._M_object = &local_a8;
  std::__throw_bad_function_call();
}

Assistant:

inline ssize_t write_content(Stream &strm,
                             ContentProviderWithCloser content_provider,
                             size_t offset, size_t length) {
  size_t begin_offset = offset;
  size_t end_offset = offset + length;
  while (offset < end_offset) {
    ssize_t written_length = 0;
    content_provider(
        offset, end_offset - offset,
        [&](const char *d, size_t l) {
          offset += l;
          written_length = strm.write(d, l);
        },
        [&](void) { written_length = -1; });
    if (written_length < 0) { return written_length; }
  }
  return static_cast<ssize_t>(offset - begin_offset);
}